

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_multiply_source_and_add<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
          (Heap_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                 *column,Field_element *val)

{
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
  *this_00;
  ulong uVar1;
  ID_index IVar2;
  uint uVar3;
  pointer ppEVar4;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar5;
  Element *e1;
  long lVar6;
  undefined4 *puVar7;
  ulong uVar8;
  const_iterator __begin0;
  pointer ppEVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_38;
  
  if (*val == 0) {
    return false;
  }
  ppEVar9 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar9 != ppEVar4) {
    this_00 = (vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
               *)(this + 8);
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
      ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                *)this_00,(long)ppEVar4 - (long)ppEVar9 >> 3);
      ppEVar9 = (column->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 = (column->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar12 = *(long *)this_00;
      if (ppEVar9 != ppEVar4) {
        uVar8 = 0;
        do {
          pEVar5 = *ppEVar9;
          IVar2 = pEVar5->rowIndex_;
          puVar7 = (undefined4 *)operator_new(8);
          *puVar7 = 0;
          puVar7[1] = IVar2;
          *(undefined4 **)(lVar12 + uVar8 * 8) = puVar7;
          lVar12 = *(long *)this_00;
          **(uint **)(lVar12 + uVar8 * 8) = (pEVar5->super_Entry_field_element_option).element_;
          ppEVar9 = ppEVar9 + 1;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (ppEVar9 != ppEVar4);
      }
      *(int *)(this + 0x20) = (int)((ulong)(*(long *)(this + 0x10) - lVar12) >> 3);
      return true;
    }
    do {
      pEVar5 = *ppEVar9;
      *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
      IVar2 = pEVar5->rowIndex_;
      local_38 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(8);
      (local_38->super_Entry_field_element_option).element_ = 0;
      local_38->rowIndex_ = IVar2;
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
      ::
      emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                (this_00,&local_38);
      e1 = *(Element **)(*(long *)(this + 0x10) + -8);
      *e1 = (pEVar5->super_Entry_field_element_option).element_;
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x28),e1,*val);
      lVar12 = *(long *)(this + 8);
      lVar6 = *(long *)(*(long *)(this + 0x10) + -8);
      lVar10 = *(long *)(this + 0x10) - lVar12 >> 3;
      uVar8 = lVar10 - 1;
      if (1 < lVar10) {
        uVar3 = *(uint *)(lVar6 + 4);
        do {
          uVar1 = uVar8 - 1;
          uVar11 = uVar1 >> 1;
          lVar10 = *(long *)(lVar12 + uVar11 * 8);
          if (uVar3 <= *(uint *)(lVar10 + 4)) goto LAB_00168d7a;
          *(long *)(lVar12 + uVar8 * 8) = lVar10;
          uVar8 = uVar11;
        } while (1 < uVar1);
        uVar8 = 0;
      }
LAB_00168d7a:
      *(long *)(lVar12 + uVar8 * 8) = lVar6;
      ppEVar9 = ppEVar9 + 1;
    } while (ppEVar9 != ppEVar4);
    if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 3) <
        (ulong)(uint)(*(int *)(this + 0x20) * 2)) {
      Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
  }
  return false;
}

Assistant:

inline bool Heap_column<Master_matrix>::_multiply_source_and_add(const Entry_range& column, const Field_element& val)
{
  if (val == 0u || column.begin() == column.end()) {
    return false;
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      column_[i++]->set_element(entry.get_element());
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(1);

  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type)
    pivotVal = get_pivot_value();

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    column_.push_back(entryPool_->construct(entry.get_row_index()));
    column_.back()->set_element(entry.get_element());
    operators_->multiply_inplace(column_.back()->get_element(), val);
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry.get_row_index() == Chain_opt::get_pivot()) {
        operators_->add_inplace(pivotVal, column_.back()->get_element());
      }
    }
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  return pivotVal == 0u;
}